

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error externalEntityInitProcessor3(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Parsing XVar1;
  int iVar2;
  XML_Error XVar3;
  char *next;
  
  parser->m_eventPtr = start;
  next = start;
  iVar2 = (*parser->m_encoding->scanners[1])(parser->m_encoding,start,end,&next);
  parser->m_eventEndPtr = next;
  if (iVar2 == -2) {
    if ((parser->m_parsingStatus).finalBuffer != '\0') {
      return XML_ERROR_PARTIAL_CHAR;
    }
  }
  else {
    if (iVar2 != -1) {
      if (iVar2 == 0xc) {
        XVar3 = processXmlDecl(parser,1,start,next);
        if (XVar3 != XML_ERROR_NONE) {
          return XVar3;
        }
        XVar1 = (parser->m_parsingStatus).parsing;
        if (XVar1 == XML_FINISHED) {
          return XML_ERROR_ABORTED;
        }
        start = next;
        if (XVar1 == XML_SUSPENDED) {
          *endPtr = next;
          return XML_ERROR_NONE;
        }
      }
      parser->m_processor = externalEntityContentProcessor;
      parser->m_tagLevel = 1;
      XVar3 = externalEntityContentProcessor(parser,start,end,endPtr);
      return XVar3;
    }
    if ((parser->m_parsingStatus).finalBuffer != '\0') {
      return XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  *endPtr = start;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityInitProcessor3(XML_Parser parser,
                             const char *start,
                             const char *end,
                             const char **endPtr)
{
  int tok;
  const char *next = start; /* XmlContentTok doesn't always set the last arg */
  parser->m_eventPtr = start;
  tok = XmlContentTok(parser->m_encoding, start, end, &next);
  parser->m_eventEndPtr = next;

  switch (tok) {
  case XML_TOK_XML_DECL:
    {
      enum XML_Error result;
      result = processXmlDecl(parser, 1, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      switch (parser->m_parsingStatus.parsing) {
      case XML_SUSPENDED:
        *endPtr = next;
        return XML_ERROR_NONE;
      case XML_FINISHED:
        return XML_ERROR_ABORTED;
      default:
        start = next;
      }
    }
    break;
  case XML_TOK_PARTIAL:
    if (!parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (!parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_PARTIAL_CHAR;
  }
  parser->m_processor = externalEntityContentProcessor;
  parser->m_tagLevel = 1;
  return externalEntityContentProcessor(parser, start, end, endPtr);
}